

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::FirstMatchAssertionExpr::fromSyntax
          (FirstMatchSequenceExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  SequenceExprSyntax *pSVar2;
  undefined4 extraout_var;
  FirstMatchAssertionExpr *pFVar3;
  sockaddr *in_RSI;
  long in_RDI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> matchItems;
  AssertionExpr *seq;
  Compilation *comp;
  AssertionExpr *in_stack_00000280;
  ASTContext *in_stack_00000288;
  SequenceMatchListSyntax *in_stack_00000290;
  ASTContext *in_stack_ffffffffffffffb8;
  AssertionExpr *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd0;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffd8;
  BumpAllocator *this;
  
  ASTContext::getCompilation((ASTContext *)0x9cdd48);
  pSVar2 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x9cdd5b);
  iVar1 = AssertionExpr::bind((int)pSVar2,in_RSI,0);
  this = (BumpAllocator *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9cdd88);
  if (*(long *)(in_RDI + 0x40) != 0) {
    sVar4 = bindMatchItems(in_stack_00000290,in_stack_00000288,in_stack_00000280);
    in_stack_ffffffffffffffd0 =
         (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)sVar4._M_ptr;
    local_38 = sVar4._M_extent._M_extent_value;
    in_stack_ffffffffffffffd8._M_extent_value = local_38;
  }
  pFVar3 = BumpAllocator::
           emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                     (this,(AssertionExpr *)in_stack_ffffffffffffffd8._M_extent_value,
                      in_stack_ffffffffffffffd0);
  return &pFVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& FirstMatchAssertionExpr::fromSyntax(const FirstMatchSequenceExprSyntax& syntax,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& seq = bind(*syntax.expr, context);
    seq.requireSequence(context);

    std::span<const Expression* const> matchItems;
    if (syntax.matchList)
        matchItems = bindMatchItems(*syntax.matchList, context, seq);

    return *comp.emplace<FirstMatchAssertionExpr>(seq, matchItems);
}